

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

string * __thiscall
tinyusdz::usda::USDAReader::get_error_abi_cxx11_(string *__return_storage_ptr__,USDAReader *this)

{
  USDAReader *this_local;
  
  Impl::GetError_abi_cxx11_(__return_storage_ptr__,this->_impl);
  return __return_storage_ptr__;
}

Assistant:

std::string USDAReader::get_error() { return _impl->GetError(); }